

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::String::operator=(String *this,String *param_1)

{
  String *param_1_local;
  String *this_local;
  
  Array<char>::operator=(&this->content,&param_1->content);
  return this;
}

Assistant:

String() = default;